

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

iterator __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::erase
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,const_iterator pos)

{
  iterator in_RSI;
  SmallVectorBase<(anonymous_namespace)::Constructable> *in_RDI;
  iterator result;
  iterator __result;
  undefined1 in_stack_ffffffffffffffd8 [16];
  
  __result = in_RSI + 1;
  end(in_RDI);
  std::ranges::__move_fn::
  operator()<(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*>
            (in_stack_ffffffffffffffd8._8_8_,in_stack_ffffffffffffffd8._0_8_,(Constructable *)in_RDI
             ,__result);
  pop_back(in_RDI);
  return in_RSI;
}

Assistant:

iterator erase(const_iterator pos) {
        // const_cast is fine, this is a non-const member function.
        iterator result = const_cast<iterator>(pos);

        std::ranges::move(result + 1, end(), result);
        pop_back();
        return result;
    }